

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

double __thiscall
chrono::curiosity::Curiosity::GetWheelTracTorque(Curiosity *this,CuriosityWheelID id)

{
  int iVar1;
  element_type *peVar2;
  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  CuriosityWheelID id_local;
  Curiosity *this_local;
  
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_driver);
  iVar1 = (*peVar2->_vptr_CuriosityDriver[2])();
  if (iVar1 == 1) {
    this_local = (Curiosity *)0x0;
  }
  else {
    this_00 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                           (&this->m_drive_motors,(ulong)id);
    peVar3 = std::
             __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    this_local = (Curiosity *)(**(code **)(*(long *)peVar3 + 0x280))();
  }
  return (double)this_local;
}

Assistant:

double Curiosity::GetWheelTracTorque(CuriosityWheelID id) const {
    if (m_driver->GetDriveMotorType() == CuriosityDriver::DriveMotorType::TORQUE)
        return 0;

    return m_drive_motors[id]->GetMotorTorque();
}